

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DwaCompressor::DwaCompressor
          (DwaCompressor *this,Header *hdr,int maxScanLineSize,int numScanLines,
          AcCompression acCompression)

{
  int iVar1;
  Box2i *pBVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Header *in_RSI;
  Compressor *in_RDI;
  undefined4 in_R8D;
  float fVar3;
  int i;
  ChannelList *in_stack_ffffffffffffff58;
  Header *in_stack_ffffffffffffff60;
  int local_30;
  
  Compressor::Compressor(in_RDI,in_RSI);
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__DwaCompressor_004c0640;
  *(undefined4 *)&in_RDI[1]._vptr_Compressor = in_R8D;
  *(undefined4 *)((long)&in_RDI[1]._vptr_Compressor + 4) = in_EDX;
  *(undefined4 *)&in_RDI[1]._header = in_ECX;
  Header::channels((Header *)0x1c9c1a);
  ChannelList::ChannelList((ChannelList *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
  ::vector((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            *)0x1c9c45);
  std::
  vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
  ::vector((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
            *)0x1c9c58);
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  vector((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
          *)0x1c9c6e);
  in_RDI[10]._header = (Header *)0x0;
  in_RDI[0xb]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xb]._header = (Header *)0x0;
  in_RDI[0xc]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xc]._header = (Header *)0x0;
  in_RDI[0xd]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xd]._header = (Header *)0x0;
  in_RDI[0xe]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0x11]._header = (Header *)0x0;
  iVar1 = Header::zipCompressionLevel(in_stack_ffffffffffffff60);
  *(int *)&in_RDI[0x12]._vptr_Compressor = iVar1;
  fVar3 = Header::dwaCompressionLevel(in_stack_ffffffffffffff60);
  *(float *)((long)&in_RDI[0x12]._vptr_Compressor + 4) = fVar3;
  pBVar2 = Header::dataWindow((Header *)0x1c9d40);
  *(int *)((long)&in_RDI[1]._header + 4) = (pBVar2->min).x;
  pBVar2 = Header::dataWindow((Header *)0x1c9d63);
  *(int *)&in_RDI[2]._vptr_Compressor = (pBVar2->min).y;
  pBVar2 = Header::dataWindow((Header *)0x1c9d87);
  *(int *)((long)&in_RDI[2]._vptr_Compressor + 4) = (pBVar2->max).x;
  pBVar2 = Header::dataWindow((Header *)0x1c9dab);
  *(int *)&in_RDI[2]._header = (pBVar2->max).y;
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    (&in_RDI[0xe]._header)[local_30] = (Header *)0x0;
    (&in_RDI[0x10]._vptr_Compressor)[local_30] = (_func_int **)0x0;
  }
  return;
}

Assistant:

DwaCompressor::DwaCompressor (
    const Header& hdr,
    int           maxScanLineSize,
    int           numScanLines,
    AcCompression acCompression)
    : Compressor (hdr)
    , _acCompression (acCompression)
    , _maxScanLineSize (maxScanLineSize)
    , _numScanLines (numScanLines)
    , _channels (hdr.channels ())
    , _packedAcBuffer (nullptr)
    , _packedAcBufferSize (0)
    , _packedDcBuffer (nullptr)
    , _packedDcBufferSize (0)
    , _rleBuffer (nullptr)
    , _rleBufferSize (0)
    , _outBuffer (nullptr)
    , _outBufferSize (0)
    , _zip (nullptr)
    , _zipLevel (hdr.zipCompressionLevel ())
    , _dwaCompressionLevel (hdr.dwaCompressionLevel ())
{
    _min[0] = hdr.dataWindow ().min.x;
    _min[1] = hdr.dataWindow ().min.y;
    _max[0] = hdr.dataWindow ().max.x;
    _max[1] = hdr.dataWindow ().max.y;

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        _planarUncBuffer[i]     = 0;
        _planarUncBufferSize[i] = 0;
    }
}